

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O0

void __thiscall
dg::DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv>::DGLLVMPointerAnalysisImpl
          (DGLLVMPointerAnalysisImpl<dg::pta::PointerAnalysisFSInv> *this,PointerGraph *PS,
          LLVMPointerGraphBuilder *b,LLVMPointerAnalysisOptions *opts)

{
  PointerAnalysisOptions *in_RCX;
  PointerGraph *in_RDX;
  PointerAnalysisOptions *in_RSI;
  PointerAnalysisOptions *in_RDI;
  
  PointerAnalysisOptions::PointerAnalysisOptions(in_RDI,in_RSI);
  pta::PointerAnalysisFSInv::PointerAnalysisFSInv((PointerAnalysisFSInv *)in_RSI,in_RDX,in_RCX);
  PointerAnalysisOptions::~PointerAnalysisOptions((PointerAnalysisOptions *)0x17865b);
  (in_RDI->super_AnalysisOptions).fieldSensitivity.offset =
       (type)&PTR__DGLLVMPointerAnalysisImpl_001b0a48;
  *(PointerGraph **)
   &in_RDI[2].super_AnalysisOptions.allocationFunctions._M_t._M_impl.super__Rb_tree_header._M_header
       = in_RDX;
  return;
}

Assistant:

DGLLVMPointerAnalysisImpl(PointerGraph *PS, LLVMPointerGraphBuilder *b,
                              const LLVMPointerAnalysisOptions &opts)
            : PTType(PS, opts), builder(b) {}